

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_edge_sse4.c
# Opt level: O1

void av1_highbd_filter_intra_edge_sse4_1(uint16_t *p,int sz,int strength)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 (*pauVar3) [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 (*pauVar7) [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar18 [16];
  short sVar25;
  undefined1 auVar19 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  short sVar8;
  short sVar12;
  
  if (strength != 0) {
    p[-1] = *p;
    auVar9 = pshuflw(ZEXT216(p[(long)sz + -1]),ZEXT216(p[(long)sz + -1]),0);
    auVar9._4_4_ = auVar9._0_4_;
    auVar9._8_4_ = auVar9._0_4_;
    auVar9._12_4_ = auVar9._0_4_;
    *(undefined1 (*) [16])(p + sz) = auVar9;
    pauVar3 = (undefined1 (*) [16])(p + -1);
    if (strength != 3) {
      pauVar3 = (undefined1 (*) [16])p;
    }
    pauVar7 = (undefined1 (*) [16])(p + 1);
    if (strength < 3) {
      if (1 < sz) {
        auVar14 = lddqu(in_XMM2,pauVar3[1]);
        auVar9 = lddqu(auVar9,*pauVar3);
        auVar13 = lddqu(in_XMM1,(undefined1  [16])av1_highbd_filter_intra_edge_sse4_1::v_const[0]);
        auVar15 = lddqu(in_XMM3,(undefined1  [16])
                                av1_upsample_intra_edge_sse4_1::v_const[(long)strength + 1]);
        pauVar3 = pauVar3 + 2;
        auVar16 = pmovsxbw(in_XMM4,0x808080808080808);
        uVar5 = sz - 1U;
        do {
          auVar2._16_16_ = auVar14;
          auVar2._0_16_ = auVar9;
          sVar8 = auVar9._4_2_;
          sVar12 = auVar9._6_2_;
          sVar20 = auVar9._8_2_;
          sVar21 = auVar9._10_2_;
          sVar22 = auVar9._12_2_;
          sVar23 = auVar9._14_2_;
          auVar26._0_2_ = (sVar8 + auVar9._0_2_) * auVar15._0_2_;
          auVar26._2_2_ = auVar9._2_2_ * auVar15._2_2_;
          auVar26._4_2_ = (sVar12 + auVar9._2_2_) * auVar15._4_2_;
          auVar26._6_2_ = sVar8 * auVar15._6_2_;
          auVar26._8_2_ = (sVar20 + sVar8) * auVar15._8_2_;
          auVar26._10_2_ = sVar12 * auVar15._10_2_;
          auVar26._12_2_ = (sVar21 + sVar12) * auVar15._12_2_;
          auVar26._14_2_ = sVar20 * auVar15._14_2_;
          auVar18._0_2_ = (sVar22 + sVar20) * auVar15._0_2_;
          auVar18._2_2_ = sVar21 * auVar15._2_2_;
          auVar18._4_2_ = (sVar23 + sVar21) * auVar15._4_2_;
          auVar18._6_2_ = sVar22 * auVar15._6_2_;
          auVar18._8_2_ = (auVar14._0_2_ + sVar22) * auVar15._8_2_;
          auVar18._10_2_ = sVar23 * auVar15._10_2_;
          auVar18._12_2_ = (auVar14._2_2_ + sVar23) * auVar15._12_2_;
          auVar18._14_2_ = auVar14._0_2_ * auVar15._14_2_;
          auVar9 = phaddw(auVar26,auVar18);
          uVar6 = 8;
          if ((int)uVar5 < 8) {
            uVar6 = uVar5;
          }
          auVar27._0_2_ = (ushort)(auVar9._0_2_ + auVar16._0_2_) >> 4;
          auVar27._2_2_ = (ushort)(auVar9._2_2_ + auVar16._2_2_) >> 4;
          auVar27._4_2_ = (ushort)(auVar9._4_2_ + auVar16._4_2_) >> 4;
          auVar27._6_2_ = (ushort)(auVar9._6_2_ + auVar16._6_2_) >> 4;
          auVar27._8_2_ = (ushort)(auVar9._8_2_ + auVar16._8_2_) >> 4;
          auVar27._10_2_ = (ushort)(auVar9._10_2_ + auVar16._10_2_) >> 4;
          auVar27._12_2_ = (ushort)(auVar9._12_2_ + auVar16._12_2_) >> 4;
          auVar27._14_2_ = (ushort)(auVar9._14_2_ + auVar16._14_2_) >> 4;
          auVar17 = lddqu(auVar2._2_16_,*pauVar7);
          auVar9 = pshuflw(ZEXT416(uVar6),ZEXT416(uVar6),0);
          sVar8 = auVar9._0_2_;
          auVar10._0_2_ = -(ushort)(auVar13._0_2_ < sVar8);
          sVar12 = auVar9._2_2_;
          auVar10._2_2_ = -(ushort)(auVar13._2_2_ < sVar12);
          auVar10._4_2_ = -(ushort)(auVar13._4_2_ < sVar8);
          auVar10._6_2_ = -(ushort)(auVar13._6_2_ < sVar12);
          auVar10._8_2_ = -(ushort)(auVar13._8_2_ < sVar8);
          auVar10._10_2_ = -(ushort)(auVar13._10_2_ < sVar12);
          auVar10._12_2_ = -(ushort)(auVar13._12_2_ < sVar8);
          auVar10._14_2_ = -(ushort)(auVar13._14_2_ < sVar12);
          auVar9 = pblendvb(auVar17,auVar27,auVar10);
          *pauVar7 = auVar9;
          auVar17 = lddqu(auVar14,*pauVar3);
          pauVar7 = pauVar7 + 1;
          pauVar3 = pauVar3 + 1;
          uVar4 = uVar5 - uVar6;
          bVar1 = (int)uVar6 <= (int)uVar5;
          auVar9 = auVar14;
          auVar14 = auVar17;
          uVar5 = uVar4;
        } while (uVar4 != 0 && bVar1);
      }
    }
    else if (1 < sz) {
      auVar14 = lddqu(in_XMM2,pauVar3[1]);
      auVar9 = lddqu(auVar9,*pauVar3);
      auVar13 = lddqu(in_XMM1,(undefined1  [16])av1_highbd_filter_intra_edge_sse4_1::v_const[0]);
      auVar15 = lddqu(in_XMM3,(undefined1  [16])
                              av1_highbd_filter_intra_edge_sse4_1::kern[strength - 1]);
      pauVar3 = pauVar3 + 2;
      auVar16 = pmovsxbw(in_XMM4,0x808080808080808);
      uVar5 = sz - 1U;
      do {
        sVar8 = auVar9._4_2_;
        sVar12 = auVar9._6_2_;
        sVar20 = auVar9._8_2_;
        sVar21 = auVar9._10_2_;
        sVar22 = auVar9._12_2_;
        sVar23 = auVar9._14_2_;
        sVar24 = auVar14._0_2_;
        sVar25 = auVar14._2_2_;
        auVar17._0_2_ = sVar12 + sVar8 + auVar9._2_2_;
        auVar17._2_2_ = sVar20 + sVar12 + sVar8;
        auVar17._4_2_ = sVar21 + sVar20 + sVar12;
        auVar17._6_2_ = sVar22 + sVar21 + sVar20;
        auVar17._8_2_ = sVar23 + sVar22 + sVar21;
        auVar17._10_2_ = sVar24 + sVar23 + sVar22;
        auVar17._12_2_ = sVar25 + sVar24 + sVar23;
        auVar17._14_2_ = auVar14._4_2_ + sVar25 + sVar24;
        auVar28._0_2_ = (sVar20 + auVar9._0_2_) * auVar15._0_2_;
        auVar28._2_2_ = auVar17._0_2_ * auVar15._2_2_;
        auVar28._4_2_ = (sVar21 + auVar9._2_2_) * auVar15._4_2_;
        auVar28._6_2_ = auVar17._2_2_ * auVar15._6_2_;
        auVar28._8_2_ = (sVar22 + sVar8) * auVar15._8_2_;
        auVar28._10_2_ = auVar17._4_2_ * auVar15._10_2_;
        auVar28._12_2_ = (sVar23 + sVar12) * auVar15._12_2_;
        auVar28._14_2_ = auVar17._6_2_ * auVar15._14_2_;
        auVar19._0_2_ = (sVar24 + sVar20) * auVar15._0_2_;
        auVar19._2_2_ = auVar17._8_2_ * auVar15._2_2_;
        auVar19._4_2_ = (sVar25 + sVar21) * auVar15._4_2_;
        auVar19._6_2_ = auVar17._10_2_ * auVar15._6_2_;
        auVar19._8_2_ = (auVar14._4_2_ + sVar22) * auVar15._8_2_;
        auVar19._10_2_ = auVar17._12_2_ * auVar15._10_2_;
        auVar19._12_2_ = (auVar14._6_2_ + sVar23) * auVar15._12_2_;
        auVar19._14_2_ = auVar17._14_2_ * auVar15._14_2_;
        auVar9 = phaddw(auVar28,auVar19);
        uVar6 = 8;
        if ((int)uVar5 < 8) {
          uVar6 = uVar5;
        }
        auVar29._0_2_ = (ushort)(auVar9._0_2_ + auVar16._0_2_) >> 4;
        auVar29._2_2_ = (ushort)(auVar9._2_2_ + auVar16._2_2_) >> 4;
        auVar29._4_2_ = (ushort)(auVar9._4_2_ + auVar16._4_2_) >> 4;
        auVar29._6_2_ = (ushort)(auVar9._6_2_ + auVar16._6_2_) >> 4;
        auVar29._8_2_ = (ushort)(auVar9._8_2_ + auVar16._8_2_) >> 4;
        auVar29._10_2_ = (ushort)(auVar9._10_2_ + auVar16._10_2_) >> 4;
        auVar29._12_2_ = (ushort)(auVar9._12_2_ + auVar16._12_2_) >> 4;
        auVar29._14_2_ = (ushort)(auVar9._14_2_ + auVar16._14_2_) >> 4;
        auVar17 = lddqu(auVar17,*pauVar7);
        auVar9 = pshuflw(ZEXT416(uVar6),ZEXT416(uVar6),0);
        sVar8 = auVar9._0_2_;
        auVar11._0_2_ = -(ushort)(auVar13._0_2_ < sVar8);
        sVar12 = auVar9._2_2_;
        auVar11._2_2_ = -(ushort)(auVar13._2_2_ < sVar12);
        auVar11._4_2_ = -(ushort)(auVar13._4_2_ < sVar8);
        auVar11._6_2_ = -(ushort)(auVar13._6_2_ < sVar12);
        auVar11._8_2_ = -(ushort)(auVar13._8_2_ < sVar8);
        auVar11._10_2_ = -(ushort)(auVar13._10_2_ < sVar12);
        auVar11._12_2_ = -(ushort)(auVar13._12_2_ < sVar8);
        auVar11._14_2_ = -(ushort)(auVar13._14_2_ < sVar12);
        auVar9 = pblendvb(auVar17,auVar29,auVar11);
        *pauVar7 = auVar9;
        auVar17 = lddqu(auVar14,*pauVar3);
        pauVar7 = pauVar7 + 1;
        pauVar3 = pauVar3 + 1;
        uVar4 = uVar5 - uVar6;
        bVar1 = (int)uVar6 <= (int)uVar5;
        auVar9 = auVar14;
        auVar14 = auVar17;
        uVar5 = uVar4;
      } while (uVar4 != 0 && bVar1);
    }
  }
  return;
}

Assistant:

void av1_highbd_filter_intra_edge_sse4_1(uint16_t *p, int sz, int strength) {
  if (!strength) return;

  DECLARE_ALIGNED(16, static const int16_t, kern[3][8]) = {
    { 4, 8, 4, 8, 4, 8, 4, 8 },  // strength 1: 4,8,4
    { 5, 6, 5, 6, 5, 6, 5, 6 },  // strength 2: 5,6,5
    { 2, 4, 2, 4, 2, 4, 2, 4 }   // strength 3: 2,4,4,4,2
  };

  DECLARE_ALIGNED(16, static const int16_t,
                  v_const[1][8]) = { { 0, 1, 2, 3, 4, 5, 6, 7 } };

  // Extend the first and last samples to simplify the loop for the 5-tap case
  p[-1] = p[0];
  __m128i last = _mm_set1_epi16(p[sz - 1]);
  _mm_storeu_si128((__m128i *)&p[sz], last);

  // Adjust input pointer for filter support area
  uint16_t *in = (strength == 3) ? p - 1 : p;

  // Avoid modifying first sample
  uint16_t *out = p + 1;
  int len = sz - 1;

  const int use_3tap_filter = (strength < 3);

  if (use_3tap_filter) {
    __m128i coef0 = _mm_lddqu_si128((__m128i const *)kern[strength - 1]);
    __m128i iden = _mm_lddqu_si128((__m128i *)v_const[0]);
    __m128i in0 = _mm_lddqu_si128((__m128i *)&in[0]);
    __m128i in8 = _mm_lddqu_si128((__m128i *)&in[8]);
    while (len > 0) {
      int n_out = (len < 8) ? len : 8;
      __m128i in1 = _mm_alignr_epi8(in8, in0, 2);
      __m128i in2 = _mm_alignr_epi8(in8, in0, 4);
      __m128i in02 = _mm_add_epi16(in0, in2);
      __m128i d0 = _mm_unpacklo_epi16(in02, in1);
      __m128i d1 = _mm_unpackhi_epi16(in02, in1);
      d0 = _mm_mullo_epi16(d0, coef0);
      d1 = _mm_mullo_epi16(d1, coef0);
      d0 = _mm_hadd_epi16(d0, d1);
      __m128i eight = _mm_set1_epi16(8);
      d0 = _mm_add_epi16(d0, eight);
      d0 = _mm_srli_epi16(d0, 4);
      __m128i out0 = _mm_lddqu_si128((__m128i *)out);
      __m128i n0 = _mm_set1_epi16(n_out);
      __m128i mask = _mm_cmpgt_epi16(n0, iden);
      out0 = _mm_blendv_epi8(out0, d0, mask);
      _mm_storeu_si128((__m128i *)out, out0);
      in += 8;
      in0 = in8;
      in8 = _mm_lddqu_si128((__m128i *)&in[8]);
      out += 8;
      len -= n_out;
    }
  } else {  // 5-tap filter
    __m128i coef0 = _mm_lddqu_si128((__m128i const *)kern[strength - 1]);
    __m128i iden = _mm_lddqu_si128((__m128i *)v_const[0]);
    __m128i in0 = _mm_lddqu_si128((__m128i *)&in[0]);
    __m128i in8 = _mm_lddqu_si128((__m128i *)&in[8]);
    while (len > 0) {
      int n_out = (len < 8) ? len : 8;
      __m128i in1 = _mm_alignr_epi8(in8, in0, 2);
      __m128i in2 = _mm_alignr_epi8(in8, in0, 4);
      __m128i in3 = _mm_alignr_epi8(in8, in0, 6);
      __m128i in4 = _mm_alignr_epi8(in8, in0, 8);
      __m128i in04 = _mm_add_epi16(in0, in4);
      __m128i in123 = _mm_add_epi16(in1, in2);
      in123 = _mm_add_epi16(in123, in3);
      __m128i d0 = _mm_unpacklo_epi16(in04, in123);
      __m128i d1 = _mm_unpackhi_epi16(in04, in123);
      d0 = _mm_mullo_epi16(d0, coef0);
      d1 = _mm_mullo_epi16(d1, coef0);
      d0 = _mm_hadd_epi16(d0, d1);
      __m128i eight = _mm_set1_epi16(8);
      d0 = _mm_add_epi16(d0, eight);
      d0 = _mm_srli_epi16(d0, 4);
      __m128i out0 = _mm_lddqu_si128((__m128i *)out);
      __m128i n0 = _mm_set1_epi16(n_out);
      __m128i mask = _mm_cmpgt_epi16(n0, iden);
      out0 = _mm_blendv_epi8(out0, d0, mask);
      _mm_storeu_si128((__m128i *)out, out0);
      in += 8;
      in0 = in8;
      in8 = _mm_lddqu_si128((__m128i *)&in[8]);
      out += 8;
      len -= n_out;
    }
  }
}